

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall helics::BrokerBase::configureBase(BrokerBase *this)

{
  pointer pcVar1;
  BaseTimeCoordinator *pBVar2;
  BaseTimeCoordinator *pBVar3;
  ForwardingTimeCoordinator *this_00;
  thread local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  BrokerBase *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  code *local_28;
  undefined8 local_20;
  
  if (this->debugging == true) {
    this->no_ping = true;
    this->disable_timer = true;
  }
  if ((this->networkTimeout).internalTimeCode < 0) {
    (this->networkTimeout).internalTimeCode = 4000000000;
  }
  if ((this->noAutomaticID == false) && ((this->identifier)._M_string_length == 0)) {
    configureBase(this);
  }
  if (((((this->identifier)._M_string_length == 0x24) &&
       (pcVar1 = (this->identifier)._M_dataplus._M_p, pcVar1[8] == '-')) && (pcVar1[0xc] == '-')) &&
     ((pcVar1[0x10] == '-' && (pcVar1[0x14] == '-')))) {
    this->uuid_like = true;
  }
  if (this->asyncTime == true) {
    pBVar3 = (BaseTimeCoordinator *)operator_new(0x78);
    pBVar3->_vptr_BaseTimeCoordinator = (_func_int **)0x0;
    (pBVar3->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar3->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar3->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pBVar3->dependencies).mDelayedDependency = 0;
    *(undefined8 *)&(pBVar3->sendMessageFunction).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pBVar3->sendMessageFunction).super__Function_base._M_functor + 8) = 0;
    (pBVar3->sendMessageFunction).super__Function_base._M_manager = (_Manager_type)0x0;
    (pBVar3->sendMessageFunction)._M_invoker = (_Invoker_type)0x0;
    pBVar3->mSourceId = 0;
    pBVar3->sequenceCounter = 0;
    pBVar3->noParent = false;
    pBVar3->federatesOnly = false;
    pBVar3->checkingExec = false;
    pBVar3->executionMode = false;
    pBVar3->restrictive_time_policy = false;
    pBVar3->nonGranting = false;
    pBVar3->delayedTiming = false;
    pBVar3->disconnected = false;
    pBVar3[1]._vptr_BaseTimeCoordinator = (_func_int **)0x0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseTimeCoordinator::BaseTimeCoordinator(pBVar3);
    pBVar3->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__BaseTimeCoordinator_004dd650;
    pBVar3[1]._vptr_BaseTimeCoordinator = (_func_int **)0x8000000000000001;
    *(undefined1 *)
     &pBVar3[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7fffffffffffffff;
    *(undefined1 *)
     &pBVar3[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
  }
  else {
    if (this->globalTime != true) {
      this_00 = (ForwardingTimeCoordinator *)operator_new(0x110);
      memset(this_00,0,0x110);
      ForwardingTimeCoordinator::ForwardingTimeCoordinator(this_00);
      pBVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      (this->timeCoord)._M_t.
      super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
      .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
           (BaseTimeCoordinator *)this_00;
      if (pBVar3 != (BaseTimeCoordinator *)0x0) {
        (*pBVar3->_vptr_BaseTimeCoordinator[1])();
      }
      goto LAB_00299b22;
    }
    pBVar3 = (BaseTimeCoordinator *)operator_new(0x78);
    pBVar3->_vptr_BaseTimeCoordinator = (_func_int **)0x0;
    (pBVar3->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar3->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar3->dependencies).dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(pBVar3->dependencies).mDelayedDependency = 0;
    *(undefined8 *)&(pBVar3->sendMessageFunction).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pBVar3->sendMessageFunction).super__Function_base._M_functor + 8) = 0;
    (pBVar3->sendMessageFunction).super__Function_base._M_manager = (_Manager_type)0x0;
    (pBVar3->sendMessageFunction)._M_invoker = (_Invoker_type)0x0;
    pBVar3->mSourceId = 0;
    pBVar3->sequenceCounter = 0;
    pBVar3->noParent = false;
    pBVar3->federatesOnly = false;
    pBVar3->checkingExec = false;
    pBVar3->executionMode = false;
    pBVar3->restrictive_time_policy = false;
    pBVar3->nonGranting = false;
    pBVar3->delayedTiming = false;
    pBVar3->disconnected = false;
    pBVar3[1]._vptr_BaseTimeCoordinator = (_func_int **)0x0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BaseTimeCoordinator::BaseTimeCoordinator(pBVar3);
    pBVar3->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__BaseTimeCoordinator_004dd5b8;
    pBVar3[1]._vptr_BaseTimeCoordinator = (_func_int **)0x8000000000000001;
    *(undefined1 *)
     &pBVar3[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
    pBVar3[1].dependencies.dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7fffffffffffffff;
    *(undefined2 *)
     &pBVar3[1].dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0x100;
  }
  pBVar2 = (this->timeCoord)._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl = pBVar3;
  if (pBVar2 != (BaseTimeCoordinator *)0x0) {
    (*pBVar2->_vptr_BaseTimeCoordinator[1])();
  }
  this->hasTimeDependency = true;
LAB_00299b22:
  local_78._8_8_ = 0;
  pcStack_60 = CLI::std::
               _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:542:33)>
               ::_M_invoke;
  local_68 = CLI::std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:542:33)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  BaseTimeCoordinator::setMessageSender
            ((this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
             (function<void_(const_helics::ActionMessage_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  ((this->timeCoord)._M_t.
   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
   ._M_t.
   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
  restrictive_time_policy = this->restrictive_time_policy;
  local_48._8_8_ = 0;
  pcStack_30 = CLI::std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:545:38)>
               ::_M_invoke;
  local_38 = CLI::std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:545:38)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)
             &((this->mLogManager).
               super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mTransmit
             ,(function<void_(helics::ActionMessage_&&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  LogManager::initializeLogging
            ((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&this->identifier);
  LOCK();
  (this->maxLogLevel).super___atomic_base<int>._M_i =
       (((this->mLogManager).super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->maxLogLevel).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (this->mainLoopIsRunning)._M_base._M_i = true;
  UNLOCK();
  local_28 = queueProcessingLoop;
  local_20 = 0;
  local_50 = this;
  std::thread::thread<void(helics::BrokerBase::*)(),helics::BrokerBase*,void>
            (&local_80,(offset_in_BrokerBase_to_subr *)&local_28,&local_50);
  if ((this->queueProcessingThread)._M_id._M_thread == 0) {
    (this->queueProcessingThread)._M_id._M_thread = (native_handle_type)local_80._M_id._M_thread;
    LOCK();
    (this->brokerState)._M_i = CONFIGURED;
    UNLOCK();
    return;
  }
  std::terminate();
}

Assistant:

void BrokerBase::configureBase()
{
    if (debugging) {
        no_ping = true;
        disable_timer = true;
    }
    if (networkTimeout < timeZero) {
        networkTimeout = 4.0;
    }

    if (!noAutomaticID) {
        if (identifier.empty()) {
            identifier = genId();
        }
    }

    if (identifier.size() == 36) {
        if (identifier[8] == '-' && identifier[12] == '-' && identifier[16] == '-' &&
            identifier[20] == '-') {
            uuid_like = true;
        }
    }
    if (asyncTime) {
        timeCoord = std::make_unique<AsyncTimeCoordinator>();
        hasTimeDependency = true;
    } else if (globalTime) {
        timeCoord = std::make_unique<GlobalTimeCoordinator>();
        hasTimeDependency = true;
    } else {
        timeCoord = std::make_unique<ForwardingTimeCoordinator>();
    }

    timeCoord->setMessageSender([this](const ActionMessage& msg) { addActionMessage(msg); });
    timeCoord->setRestrictivePolicy(restrictive_time_policy);

    mLogManager->setTransmitCallback([this](ActionMessage&& message) {
        if (getBrokerState() < BrokerState::TERMINATING) {
            message.source_id = global_id.load();
            addActionMessage(std::move(message));
        }
    });
    mLogManager->initializeLogging(identifier);
    maxLogLevel.store(mLogManager->getMaxLevel());
    mainLoopIsRunning.store(true);
    queueProcessingThread = std::thread(&BrokerBase::queueProcessingLoop, this);
    brokerState = BrokerState::CONFIGURED;
}